

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_f32_to_s32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  if (count != 0) {
    uVar2 = 0;
    do {
      fVar1 = *(float *)((long)src + uVar2 * 4);
      iVar3 = -0x7fffffff;
      if (-1.0 <= fVar1) {
        dVar4 = (double)fVar1;
        dVar5 = 1.0;
        if (dVar4 <= 1.0) {
          dVar5 = dVar4;
        }
        iVar3 = (int)(dVar5 * 2147483647.0);
      }
      *(int *)((long)dst + uVar2 * 4) = iVar3;
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < count);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_f32_to_s32__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_int32* dst_s32 = (ma_int32*)dst;
    const float* src_f32 = (const float*)src;

    ma_uint32 i;
    for (i = 0; i < count; i += 1) {
        double x = src_f32[i];
        x = ((x < -1) ? -1 : ((x > 1) ? 1 : x));    /* clip */

#if 0
        /* The accurate way. */
        x = x + 1;                                  /* -1..1 to 0..2 */
        x = x * 2147483647.5;                       /* 0..2 to 0..4294967295 */
        x = x - 2147483648.0;                       /* 0...4294967295 to -2147483648..2147483647 */
#else
        /* The fast way. */
        x = x * 2147483647.0;                       /* -1..1 to -2147483647..2147483647 */
#endif

        dst_s32[i] = (ma_int32)x;
    }

    (void)ditherMode;   /* No dithering for f32 -> s32. */
}